

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O2

bool __thiscall RaptorClientAdapter::Connect(RaptorClientAdapter *this,char *addr,size_t timeout_ms)

{
  raptor_error e;
  string local_28;
  
  raptor::TcpClient::Connect
            ((TcpClient *)&e,
             (char *)(this->_impl).super___shared_ptr<raptor::TcpClient,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(size_t)addr);
  if (e._value != (Status *)0x0) {
    raptor::Status::ToString_abi_cxx11_(&local_28,e._value);
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0xa8,kLogLevelError,"server adapter: connect (%s)",local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
  }
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&e);
  return e._value == (Status *)0x0;
}

Assistant:

bool RaptorClientAdapter::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}